

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
~ItemSimilarityRecommender_ConnectedItem(ItemSimilarityRecommender_ConnectedItem *this)

{
  ItemSimilarityRecommender_ConnectedItem *this_local;
  
  ~ItemSimilarityRecommender_ConnectedItem(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ItemSimilarityRecommender_ConnectedItem::~ItemSimilarityRecommender_ConnectedItem() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}